

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O3

mecab_node_t * __thiscall
MeCab::Tokenizer<mecab_node_t,_mecab_path_t>::lookup<false>
          (Tokenizer<mecab_node_t,_mecab_path_t> *this,char *begin,char *end,
          Allocator<mecab_node_t,_mecab_path_t> *allocator,Lattice *lattice)

{
  Token *pTVar1;
  size_t sVar2;
  pointer ppVar3;
  size_t sVar4;
  short sVar5;
  unsigned_short uVar6;
  CharInfo CVar7;
  int iVar8;
  CharInfo CVar9;
  uint uVar10;
  CharInfo CVar11;
  mecab_node_t *pmVar12;
  char *pcVar13;
  mecab_node_t *pmVar14;
  result_pair_type *prVar15;
  pointer ppDVar16;
  long lVar17;
  char *pcVar18;
  char *pcVar19;
  char *p;
  ulong uVar20;
  char *pcVar21;
  char *pcVar22;
  uint *puVar23;
  undefined1 auVar24 [16];
  size_t mblen;
  int local_a0;
  size_t local_88;
  result_pair_type *local_80;
  char *local_78;
  char *local_70;
  char *local_68;
  CharProperty *local_60;
  result_pair_type *local_58;
  undefined8 local_50;
  ulong local_48;
  ulong local_40;
  size_t local_38;
  
  local_88 = 0;
  pcVar13 = begin + 0xffff;
  if ((ulong)((long)end - (long)begin) < 0xffff) {
    pcVar13 = end;
  }
  local_60 = &this->property_;
  pcVar22 = begin;
  if (pcVar13 == begin) {
    CVar7 = (CharInfo)0x0;
  }
  else {
    CVar11 = this->space_;
    do {
      CVar7 = CharProperty::getCharInfo(local_60,pcVar22,pcVar13,&local_88);
      if (((uint)CVar11 & (uint)CVar7 & 0x3ffff) == 0) break;
      pcVar22 = pcVar22 + local_88;
      CVar11 = CVar7;
    } while (pcVar22 != pcVar13);
  }
  ppDVar16 = (this->dic_).
             super__Vector_base<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_78 = pcVar13;
  local_68 = begin;
  if (ppDVar16 ==
      (this->dic_).super__Vector_base<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pmVar12 = (mecab_node_t *)0x0;
  }
  else {
    prVar15 = (allocator->results_).ptr_;
    local_38 = (long)pcVar13 - (long)pcVar22;
    local_40 = (long)pcVar22 - (long)begin;
    pmVar12 = (mecab_node_t *)0x0;
    local_48 = CONCAT44(local_48._4_4_,(uint)CVar7 >> 0x12);
    local_58 = prVar15;
    do {
      local_50 = (char *)Darts::
                         DoubleArrayImpl<char,unsigned_char,int,unsigned_int,MeCab::Darts::Length<char>>
                         ::
                         commonPrefixSearch<MeCab::Darts::DoubleArrayImpl<char,unsigned_char,int,unsigned_int,MeCab::Darts::Length<char>>::result_pair_type>
                                   ((DoubleArrayImpl<char,unsigned_char,int,unsigned_int,MeCab::Darts::Length<char>>
                                     *)&(*ppDVar16)->da_,pcVar22,prVar15,0x200,local_38,0);
      if (local_50 != (char *)0x0) {
        pcVar13 = (char *)0x0;
        do {
          local_80 = (result_pair_type *)((long)pcVar13 * 0x10);
          uVar10 = prVar15[(long)pcVar13].value;
          local_70 = pcVar13;
          if ((uVar10 & 0xff) != 0) {
            local_80 = prVar15 + (long)pcVar13;
            iVar8 = (int)uVar10 >> 8;
            pTVar1 = (*ppDVar16)->token_;
            uVar20 = 0;
            pmVar14 = pmVar12;
            do {
              pmVar12 = FreeList<mecab_node_t>::alloc((allocator->node_freelist_).ptr_);
              pmVar12->prev = (mecab_node_t *)0x0;
              pmVar12->next = (mecab_node_t *)0x0;
              pmVar12->enext = (mecab_node_t *)0x0;
              pmVar12->bnext = (mecab_node_t *)0x0;
              pmVar12->rpath = (mecab_path_t *)0x0;
              pmVar12->lpath = (mecab_path_t *)0x0;
              pmVar12->surface = (char *)0x0;
              pmVar12->feature = (char *)0x0;
              pmVar12->id = 0;
              pmVar12->length = 0;
              pmVar12->rlength = 0;
              pmVar12->rcAttr = 0;
              pmVar12->lcAttr = 0;
              pmVar12->posid = 0;
              pmVar12->char_type = '\0';
              pmVar12->stat = '\0';
              pmVar12->isbest = '\0';
              *(undefined3 *)&pmVar12->field_0x51 = 0;
              pmVar12->alpha = 0.0;
              pmVar12->beta = 0.0;
              pmVar12->prob = 0.0;
              *(undefined8 *)&pmVar12->wcost = 0;
              pmVar12->cost = 0;
              sVar2 = allocator->id_;
              allocator->id_ = sVar2 + 1;
              pmVar12->id = (uint)sVar2;
              pcVar13 = (*ppDVar16)->feature_;
              auVar24 = ZEXT416(*(uint *)((long)&pTVar1[iVar8].lcAttr + uVar20));
              auVar24 = pshuflw(auVar24,auVar24,0xe1);
              pmVar12->rcAttr = (short)auVar24._0_4_;
              pmVar12->lcAttr = (short)((uint)auVar24._0_4_ >> 0x10);
              pmVar12->posid = *(unsigned_short *)((long)&pTVar1[iVar8].posid + uVar20);
              pmVar12->wcost = *(short *)((long)&pTVar1[iVar8].wcost + uVar20);
              pmVar12->feature = pcVar13 + *(uint *)((long)&pTVar1[iVar8].feature + uVar20);
              uVar6 = (unsigned_short)local_80->length;
              pmVar12->length = uVar6;
              pmVar12->rlength = uVar6 + (short)local_40;
              pmVar12->surface = pcVar22;
              pmVar12->char_type = (uchar)local_48;
              pmVar12->bnext = pmVar14;
              uVar20 = uVar20 + 0x10;
              pmVar14 = pmVar12;
            } while ((uVar10 & 0xff) << 4 != uVar20);
          }
          pcVar13 = local_70 + 1;
          prVar15 = local_58;
        } while (pcVar13 != local_50);
      }
      ppDVar16 = ppDVar16 + 1;
    } while (ppDVar16 !=
             (this->dic_).
             super__Vector_base<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
    if ((-1 < (int)CVar7) && (pmVar12 != (mecab_node_t *)0x0)) {
      return pmVar12;
    }
  }
  pcVar19 = local_78;
  sVar2 = local_88;
  pcVar13 = pcVar22 + local_88;
  if (local_78 < pcVar13) {
    ppVar3 = (this->unk_tokens_).
             super__Vector_base<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar20 = (ulong)((uint)CVar7 >> 0xe & 0xff0);
    lVar17 = *(long *)((long)&ppVar3->second + uVar20);
    if (lVar17 != 0) {
      sVar5 = (short)local_68;
      puVar23 = (uint *)(*(long *)((long)&ppVar3->first + uVar20) + 8);
      do {
        pmVar14 = FreeList<mecab_node_t>::alloc((allocator->node_freelist_).ptr_);
        pmVar14->prev = (mecab_node_t *)0x0;
        pmVar14->next = (mecab_node_t *)0x0;
        pmVar14->enext = (mecab_node_t *)0x0;
        pmVar14->bnext = (mecab_node_t *)0x0;
        pmVar14->rpath = (mecab_path_t *)0x0;
        pmVar14->lpath = (mecab_path_t *)0x0;
        pmVar14->surface = (char *)0x0;
        pmVar14->feature = (char *)0x0;
        pmVar14->id = 0;
        pmVar14->length = 0;
        pmVar14->rlength = 0;
        pmVar14->rcAttr = 0;
        pmVar14->lcAttr = 0;
        pmVar14->posid = 0;
        pmVar14->char_type = '\0';
        pmVar14->stat = '\0';
        pmVar14->isbest = '\0';
        *(undefined3 *)&pmVar14->field_0x51 = 0;
        pmVar14->alpha = 0.0;
        pmVar14->beta = 0.0;
        pmVar14->prob = 0.0;
        pmVar14->wcost = 0;
        *(undefined6 *)&pmVar14->field_0x62 = 0;
        pmVar14->cost = 0;
        sVar4 = allocator->id_;
        allocator->id_ = sVar4 + 1;
        pmVar14->id = (uint)sVar4;
        pcVar19 = (this->unkdic_).feature_;
        auVar24 = pshuflw(ZEXT416(puVar23[-2]),ZEXT416(puVar23[-2]),0xe1);
        pmVar14->rcAttr = (short)auVar24._0_4_;
        pmVar14->lcAttr = (short)((uint)auVar24._0_4_ >> 0x10);
        pmVar14->posid = (unsigned_short)puVar23[-1];
        pmVar14->wcost = *(short *)((long)puVar23 + -2);
        pmVar14->feature = pcVar19 + *puVar23;
        pmVar14->char_type = (uchar)((uint)CVar7 >> 0x12);
        pmVar14->surface = pcVar22;
        pmVar14->length = (unsigned_short)sVar2;
        pmVar14->rlength = (short)pcVar13 - sVar5;
        pmVar14->stat = '\x01';
        pmVar14->bnext = pmVar12;
        pcVar19 = (this->unk_feature_).super_scoped_array<char>.ptr_;
        if (pcVar19 != (char *)0x0) {
          pmVar14->feature = pcVar19;
        }
        puVar23 = puVar23 + 4;
        lVar17 = lVar17 + -1;
        pmVar12 = pmVar14;
      } while (lVar17 != 0);
      return pmVar14;
    }
    if (pmVar12 != (mecab_node_t *)0x0) {
      return pmVar12;
    }
  }
  local_a0 = (int)pcVar22;
  if (((uint)CVar7 >> 0x1e & 1) == 0) {
    pcVar21 = (char *)0x0;
  }
  else {
    pcVar18 = local_78;
    if (pcVar13 != local_78) {
      uVar20 = 0;
      pcVar21 = pcVar13;
      CVar11 = CVar7;
      do {
        CVar9 = CharProperty::getCharInfo(local_60,pcVar21,pcVar19,&local_88);
        pcVar18 = pcVar21;
        if (((uint)CVar11 & (uint)CVar9 & 0x3ffff) == 0) break;
        pcVar21 = pcVar21 + local_88;
        uVar20 = uVar20 + 1;
        pcVar18 = pcVar19;
        CVar11 = CVar9;
      } while (pcVar21 != pcVar19);
      pcVar21 = pcVar18;
      if (this->max_grouping_size_ < uVar20) goto LAB_00125db3;
    }
    ppVar3 = (this->unk_tokens_).
             super__Vector_base<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar20 = (ulong)((uint)CVar7 >> 0xe & 0xff0);
    lVar17 = *(long *)((long)&ppVar3->second + uVar20);
    pcVar21 = pcVar18;
    if (lVar17 != 0) {
      local_80 = (result_pair_type *)CONCAT44(local_80._4_4_,(int)pcVar18 - local_a0);
      sVar5 = (short)local_68;
      puVar23 = (uint *)(*(long *)((long)&ppVar3->first + uVar20) + 8);
      pmVar14 = pmVar12;
      local_70 = pcVar18;
      do {
        pmVar12 = FreeList<mecab_node_t>::alloc((allocator->node_freelist_).ptr_);
        pmVar12->prev = (mecab_node_t *)0x0;
        pmVar12->next = (mecab_node_t *)0x0;
        pmVar12->enext = (mecab_node_t *)0x0;
        pmVar12->bnext = (mecab_node_t *)0x0;
        pmVar12->rpath = (mecab_path_t *)0x0;
        pmVar12->lpath = (mecab_path_t *)0x0;
        pmVar12->surface = (char *)0x0;
        pmVar12->feature = (char *)0x0;
        pmVar12->id = 0;
        pmVar12->length = 0;
        pmVar12->rlength = 0;
        pmVar12->rcAttr = 0;
        pmVar12->lcAttr = 0;
        pmVar12->posid = 0;
        pmVar12->char_type = '\0';
        pmVar12->stat = '\0';
        pmVar12->isbest = '\0';
        *(undefined3 *)&pmVar12->field_0x51 = 0;
        pmVar12->alpha = 0.0;
        pmVar12->beta = 0.0;
        pmVar12->prob = 0.0;
        pmVar12->wcost = 0;
        *(undefined6 *)&pmVar12->field_0x62 = 0;
        pmVar12->cost = 0;
        sVar2 = allocator->id_;
        allocator->id_ = sVar2 + 1;
        pmVar12->id = (uint)sVar2;
        pcVar19 = (this->unkdic_).feature_;
        auVar24 = pshuflw(ZEXT416(puVar23[-2]),ZEXT416(puVar23[-2]),0xe1);
        pmVar12->rcAttr = (short)auVar24._0_4_;
        pmVar12->lcAttr = (short)((uint)auVar24._0_4_ >> 0x10);
        pmVar12->posid = (unsigned_short)puVar23[-1];
        pmVar12->wcost = *(short *)((long)puVar23 + -2);
        pmVar12->feature = pcVar19 + *puVar23;
        pmVar12->char_type = (uchar)((uint)CVar7 >> 0x12);
        pmVar12->surface = pcVar22;
        pmVar12->length = (unsigned_short)local_80;
        pmVar12->rlength = (short)pcVar18 - sVar5;
        pmVar12->stat = '\x01';
        pmVar12->bnext = pmVar14;
        pcVar19 = (this->unk_feature_).super_scoped_array<char>.ptr_;
        if (pcVar19 != (char *)0x0) {
          pmVar12->feature = pcVar19;
        }
        puVar23 = puVar23 + 4;
        lVar17 = lVar17 + -1;
        pmVar14 = pmVar12;
        pcVar21 = local_70;
        pcVar19 = local_78;
      } while (lVar17 != 0);
    }
  }
LAB_00125db3:
  uVar10 = (uint)CVar7 >> 0x1a & 0xf;
  local_48 = (ulong)uVar10;
  if ((uVar10 != 0) && (pcVar13 <= pcVar19)) {
    local_80 = (result_pair_type *)CONCAT44(local_80._4_4_,(uint)CVar7 >> 0x12);
    local_50 = (char *)(CONCAT44(local_50._4_4_,CVar7) & 0xffffffff0003ffff);
    uVar20 = 1;
    prVar15 = (result_pair_type *)(ulong)(((uint)CVar7 >> 0x12 & 0xff) << 4);
    local_70 = pcVar21;
    local_58 = prVar15;
    do {
      if (pcVar13 != pcVar21) {
        ppVar3 = (this->unk_tokens_).
                 super__Vector_base<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar17 = *(long *)((long)&prVar15->length + (long)ppVar3);
        local_40 = uVar20;
        if (lVar17 != 0) {
          sVar5 = (short)local_68;
          puVar23 = (uint *)(*(long *)((long)&prVar15->value + (long)ppVar3) + 8);
          pmVar14 = pmVar12;
          do {
            pmVar12 = FreeList<mecab_node_t>::alloc((allocator->node_freelist_).ptr_);
            pmVar12->prev = (mecab_node_t *)0x0;
            pmVar12->next = (mecab_node_t *)0x0;
            pmVar12->enext = (mecab_node_t *)0x0;
            pmVar12->bnext = (mecab_node_t *)0x0;
            pmVar12->rpath = (mecab_path_t *)0x0;
            pmVar12->lpath = (mecab_path_t *)0x0;
            pmVar12->surface = (char *)0x0;
            pmVar12->feature = (char *)0x0;
            pmVar12->id = 0;
            pmVar12->length = 0;
            pmVar12->rlength = 0;
            pmVar12->rcAttr = 0;
            pmVar12->lcAttr = 0;
            pmVar12->posid = 0;
            pmVar12->char_type = '\0';
            pmVar12->stat = '\0';
            pmVar12->isbest = '\0';
            *(undefined3 *)&pmVar12->field_0x51 = 0;
            pmVar12->alpha = 0.0;
            pmVar12->beta = 0.0;
            pmVar12->prob = 0.0;
            pmVar12->wcost = 0;
            *(undefined6 *)&pmVar12->field_0x62 = 0;
            pmVar12->cost = 0;
            sVar2 = allocator->id_;
            allocator->id_ = sVar2 + 1;
            pmVar12->id = (uint)sVar2;
            pcVar19 = (this->unkdic_).feature_;
            auVar24 = pshuflw(ZEXT416(puVar23[-2]),ZEXT416(puVar23[-2]),0xe1);
            pmVar12->rcAttr = (short)auVar24._0_4_;
            pmVar12->lcAttr = (short)((uint)auVar24._0_4_ >> 0x10);
            pmVar12->posid = (unsigned_short)puVar23[-1];
            pmVar12->wcost = *(short *)((long)puVar23 + -2);
            pmVar12->feature = pcVar19 + *puVar23;
            pmVar12->char_type = (uchar)local_80;
            pmVar12->surface = pcVar22;
            pmVar12->length = (short)pcVar13 - (short)pcVar22;
            pmVar12->rlength = (short)pcVar13 - sVar5;
            pmVar12->stat = '\x01';
            pmVar12->bnext = pmVar14;
            pcVar19 = (this->unk_feature_).super_scoped_array<char>.ptr_;
            if (pcVar19 != (char *)0x0) {
              pmVar12->feature = pcVar19;
            }
            puVar23 = puVar23 + 4;
            lVar17 = lVar17 + -1;
            pmVar14 = pmVar12;
          } while (lVar17 != 0);
        }
        CVar11 = CharProperty::getCharInfo(local_60,pcVar13,local_78,&local_88);
        if (((uint)local_50 & (uint)CVar11) == 0) break;
        pcVar13 = pcVar13 + local_88;
        prVar15 = local_58;
        uVar20 = local_40;
        pcVar21 = local_70;
        pcVar19 = local_78;
      }
      if ((local_48 <= uVar20) || (uVar20 = uVar20 + 1, pcVar19 < pcVar13)) break;
    } while( true );
  }
  if (pmVar12 == (mecab_node_t *)0x0) {
    ppVar3 = (this->unk_tokens_).
             super__Vector_base<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar20 = (ulong)((uint)CVar7 >> 0xe & 0xff0);
    lVar17 = *(long *)((long)&ppVar3->second + uVar20);
    if (lVar17 == 0) {
      pmVar12 = (mecab_node_t *)0x0;
    }
    else {
      sVar5 = (short)local_68;
      puVar23 = (uint *)(*(long *)((long)&ppVar3->first + uVar20) + 8);
      pmVar14 = (mecab_node_t *)0x0;
      do {
        pmVar12 = FreeList<mecab_node_t>::alloc((allocator->node_freelist_).ptr_);
        pmVar12->prev = (mecab_node_t *)0x0;
        pmVar12->next = (mecab_node_t *)0x0;
        pmVar12->enext = (mecab_node_t *)0x0;
        pmVar12->bnext = (mecab_node_t *)0x0;
        pmVar12->rpath = (mecab_path_t *)0x0;
        pmVar12->lpath = (mecab_path_t *)0x0;
        pmVar12->surface = (char *)0x0;
        pmVar12->feature = (char *)0x0;
        pmVar12->id = 0;
        pmVar12->length = 0;
        pmVar12->rlength = 0;
        pmVar12->rcAttr = 0;
        pmVar12->lcAttr = 0;
        pmVar12->posid = 0;
        pmVar12->char_type = '\0';
        pmVar12->stat = '\0';
        pmVar12->isbest = '\0';
        *(undefined3 *)&pmVar12->field_0x51 = 0;
        pmVar12->alpha = 0.0;
        pmVar12->beta = 0.0;
        pmVar12->prob = 0.0;
        pmVar12->wcost = 0;
        *(undefined6 *)&pmVar12->field_0x62 = 0;
        pmVar12->cost = 0;
        sVar2 = allocator->id_;
        allocator->id_ = sVar2 + 1;
        pmVar12->id = (uint)sVar2;
        pcVar19 = (this->unkdic_).feature_;
        auVar24 = pshuflw(ZEXT416(puVar23[-2]),ZEXT416(puVar23[-2]),0xe1);
        pmVar12->rcAttr = (short)auVar24._0_4_;
        pmVar12->lcAttr = (short)((uint)auVar24._0_4_ >> 0x10);
        pmVar12->posid = (unsigned_short)puVar23[-1];
        pmVar12->wcost = *(short *)((long)puVar23 + -2);
        pmVar12->feature = pcVar19 + *puVar23;
        pmVar12->char_type = (uchar)((uint)CVar7 >> 0x12);
        pmVar12->surface = pcVar22;
        pmVar12->length = (short)pcVar13 - (short)pcVar22;
        pmVar12->rlength = (short)pcVar13 - sVar5;
        pmVar12->stat = '\x01';
        pmVar12->bnext = pmVar14;
        pcVar19 = (this->unk_feature_).super_scoped_array<char>.ptr_;
        if (pcVar19 != (char *)0x0) {
          pmVar12->feature = pcVar19;
        }
        puVar23 = puVar23 + 4;
        lVar17 = lVar17 + -1;
        pmVar14 = pmVar12;
      } while (lVar17 != 0);
    }
  }
  return pmVar12;
}

Assistant:

N *Tokenizer<N, P>::lookup(const char *begin, const char *end,
                           Allocator<N, P> *allocator, Lattice *lattice) const {
  CharInfo cinfo;
  N *result_node = 0;
  size_t mblen = 0;
  size_t clen = 0;

  end = static_cast<size_t>(end - begin) >= 65535 ? begin + 65535 : end;

  if (isPartial) {
    const size_t begin_pos = begin - lattice->sentence();
    for (size_t n = begin_pos + 1; n < lattice->size(); ++n) {
      if (lattice->boundary_constraint(n) == MECAB_TOKEN_BOUNDARY) {
        end = lattice->sentence() + n;
        break;
      }
    }
  }

  const char *begin2 = property_.seekToOtherType(begin, end, space_,
                                                 &cinfo, &mblen, &clen);

  Dictionary::result_type *daresults = allocator->mutable_results();
  const size_t results_size = allocator->results_size();

  for (std::vector<Dictionary *>::const_iterator it = dic_.begin();
       it != dic_.end(); ++it) {
    const size_t n = (*it)->commonPrefixSearch(
        begin2,
        static_cast<size_t>(end - begin2),
        daresults, results_size);

    for (size_t i = 0; i < n; ++i) {
      size_t size = (*it)->token_size(daresults[i]);
      const Token *token = (*it)->token(daresults[i]);
      for (size_t j = 0; j < size; ++j) {
        N *new_node = allocator->newNode();
        read_node_info(**it, *(token + j), &new_node);
        new_node->length = daresults[i].length;
        new_node->rlength = begin2 - begin + new_node->length;
        new_node->surface = begin2;
        new_node->stat = MECAB_NOR_NODE;
        new_node->char_type = cinfo.default_type;
        if (isPartial && !is_valid_node(lattice, new_node)) {
          continue;
        }
        new_node->bnext = result_node;
        result_node = new_node;
      }
    }
  }

  if (result_node && !cinfo.invoke) {
    return result_node;
  }

  const char *begin3 = begin2 + mblen;
  const char *group_begin3 = 0;

  if (begin3 > end) {
    ADDUNKNWON;
    if (result_node) {
    return result_node;
  }
  }

  if (cinfo.group) {
    const char *tmp = begin3;
    CharInfo fail;
    begin3 = property_.seekToOtherType(begin3, end, cinfo,
                                       &fail, &mblen, &clen);
    if (clen <= max_grouping_size_) {
      ADDUNKNWON;
    }
    group_begin3 = begin3;
    begin3 = tmp;
  }

  for (size_t i = 1; i <= cinfo.length; ++i) {
    if (begin3 > end) {
      break;
    }
    if (begin3 == group_begin3) {
      continue;
    }
    clen = i;
    ADDUNKNWON;
    if (!cinfo.isKindOf(property_.getCharInfo(begin3, end, &mblen))) {
      break;
    }
    begin3 += mblen;
  }

  if (!result_node) {
    ADDUNKNWON;
  }

  if (isPartial && !result_node) {
    begin3 = begin2;
    while (true) {
      cinfo = property_.getCharInfo(begin3, end, &mblen);
      begin3 += mblen;
      if (begin3 > end ||
          lattice->boundary_constraint(begin3 - lattice->sentence())
          != MECAB_INSIDE_TOKEN) {
        break;
      }
    }
    ADDUNKNWON;

    if (!result_node) {
      N *new_node = allocator->newNode();
      new_node->char_type = cinfo.default_type;
      new_node->surface = begin2;
      new_node->length = begin3 - begin2;
      new_node->rlength = begin3 - begin;
      new_node->stat = MECAB_UNK_NODE;
      new_node->bnext = result_node;
      new_node->feature =
          lattice->feature_constraint(begin - lattice->sentence());
      CHECK_DIE(new_node->feature);
      result_node = new_node;
    }
  }

  return result_node;
}